

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.cpp
# Opt level: O0

void adios2::core::engine::ssc::SerializeAttributes(IO *input,Buffer *output)

{
  float fVar1;
  double dVar2;
  Attribute AVar3;
  short sVar4;
  unsigned_short uVar5;
  undefined4 uVar6;
  DataType DVar7;
  int iVar8;
  uint uVar9;
  reference pvVar10;
  undefined8 uVar11;
  bool bVar12;
  uint8_t uVar13;
  DataType DVar14;
  unsigned_long *puVar15;
  pointer pAVar16;
  uint8_t *puVar17;
  void *pvVar18;
  size_t sVar19;
  long lVar20;
  unsigned_long uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  size_type sVar23;
  Attribute *pAVar24;
  char *pcVar25;
  short *psVar26;
  int *piVar27;
  long *plVar28;
  uchar *__src;
  unsigned_short *puVar29;
  uint *puVar30;
  float *pfVar31;
  double *pdVar32;
  longdouble *plVar33;
  complex<float> *pcVar34;
  complex<double> *pcVar35;
  Buffer *in_RSI;
  undefined8 in_RDI;
  uint64_t size_14;
  Attribute<std::complex<double>_> **attribute_15;
  uint64_t size_13;
  Attribute<std::complex<float>_> **attribute_14;
  uint64_t size_12;
  Attribute<long_double> **attribute_13;
  uint64_t size_11;
  Attribute<double> **attribute_12;
  uint64_t size_10;
  Attribute<float> **attribute_11;
  uint64_t size_9;
  Attribute<unsigned_long> **attribute_10;
  uint64_t size_8;
  Attribute<unsigned_int> **attribute_9;
  uint64_t size_7;
  Attribute<unsigned_short> **attribute_8;
  uint64_t size_6;
  Attribute<unsigned_char> **attribute_7;
  uint64_t size_5;
  Attribute<long> **attribute_6;
  uint64_t size_4;
  Attribute<int> **attribute_5;
  uint64_t size_3;
  Attribute<short> **attribute_4;
  uint64_t size_2;
  Attribute<signed_char> **attribute_3;
  uint64_t size_1;
  Attribute<char> **attribute_2;
  uint64_t size;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **attribute_1;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **attribute;
  uint64_t pos;
  value_type *attributePair;
  const_iterator __end3;
  const_iterator __begin3;
  AttrMap *__range3;
  AttrMap *attributeMap;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
  *in_stack_fffffffffffff3f8;
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
  *this;
  undefined4 in_stack_fffffffffffff4c8;
  undefined4 in_stack_fffffffffffff4cc;
  undefined6 in_stack_fffffffffffff4d0;
  uint8_t in_stack_fffffffffffff4d6;
  uint8_t in_stack_fffffffffffff4d7;
  allocator local_6b9;
  string local_6b8 [39];
  allocator local_691;
  string local_690 [32];
  Attribute *local_670;
  Attribute **local_668;
  unsigned_long local_660;
  allocator local_651;
  string local_650 [39];
  allocator local_629;
  string local_628 [32];
  Attribute *local_608;
  Attribute **local_600;
  unsigned_long local_5f8;
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  Attribute *local_5a0;
  Attribute **local_598;
  unsigned_long local_590;
  allocator local_581;
  string local_580 [39];
  allocator local_559;
  string local_558 [32];
  Attribute *local_538;
  Attribute **local_530;
  unsigned_long local_528;
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [32];
  Attribute *local_4d0;
  Attribute **local_4c8;
  unsigned_long local_4c0;
  allocator local_4b1;
  string local_4b0 [39];
  allocator local_489;
  string local_488 [32];
  Attribute *local_468;
  Attribute **local_460;
  unsigned_long local_458;
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [32];
  Attribute *local_400;
  Attribute **local_3f8;
  unsigned_long local_3f0;
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [32];
  Attribute *local_398;
  Attribute **local_390;
  size_type local_388;
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [32];
  Attribute *local_330;
  Attribute **local_328;
  unsigned_long local_320;
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [32];
  Attribute *local_2c8;
  Attribute **local_2c0;
  unsigned_long local_2b8;
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  Attribute *local_260;
  Attribute **local_258;
  unsigned_long local_250;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  Attribute *local_1f8;
  Attribute **local_1f0;
  size_type local_1e8;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  Attribute *local_190;
  Attribute **local_188;
  size_type local_180;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  Attribute *local_128;
  Attribute **local_120;
  unsigned_long local_118;
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  Attribute *local_c0;
  Attribute **local_b8;
  allocator local_a9;
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  Attribute *local_50;
  Attribute **local_48;
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
  *local_40;
  reference local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
  local_28;
  undefined8 local_20;
  undefined8 local_18;
  Buffer *local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = adios2::core::IO::GetAttributes_abi_cxx11_();
  local_18 = local_20;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
       ::begin(in_stack_fffffffffffff3f8);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>_>_>
       ::end(in_stack_fffffffffffff3f8);
  while (bVar12 = std::__detail::operator!=(&local_28,&local_30), bVar12) {
    local_38 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                            *)0x1b3901);
    puVar15 = Buffer::value<unsigned_long>(local_10,0);
    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                *)*puVar15;
    Buffer::resize((Buffer *)
                   CONCAT17(in_stack_fffffffffffff4d7,
                            CONCAT16(in_stack_fffffffffffff4d6,in_stack_fffffffffffff4d0)),
                   CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8));
    pAVar16 = std::
              unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
              ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                            *)0x1b3952);
    uVar11 = local_8;
    pvVar10 = local_38;
    if (*(int *)(pAVar16 + 0x28) == 0xe) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"",&local_71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"/",&local_a9);
      local_50 = adios2::core::IO::InquireAttribute<std::__cxx11::string>
                           (uVar11,pvVar10,local_70,local_a8);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      local_48 = &local_50;
      puVar17 = Buffer::operator[](local_10,(size_t)local_40);
      *puVar17 = 'B';
      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                  *)((long)&(local_40->
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                            )._M_cur + 1);
      uVar6 = *(undefined4 *)(*local_48 + 0x28);
      puVar17 = Buffer::operator[](local_10,(size_t)local_40);
      *puVar17 = (uint8_t)uVar6;
      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                  *)((long)local_40 + 1);
      uVar13 = std::__cxx11::string::size();
      puVar17 = Buffer::operator[](local_10,(size_t)local_40);
      *puVar17 = uVar13;
      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                  *)((long)local_40 + 1);
      puVar17 = Buffer::data(local_10,(size_t)local_40);
      pvVar18 = (void *)std::__cxx11::string::data();
      sVar19 = std::__cxx11::string::size();
      memcpy(puVar17,pvVar18,sVar19);
      lVar20 = std::__cxx11::string::size();
      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                  *)((long)local_40 + lVar20);
      uVar21 = std::__cxx11::string::size();
      puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
      *puVar15 = uVar21;
      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                  *)((long)local_40 + 8);
      puVar17 = Buffer::data(local_10,(size_t)local_40);
      pvVar18 = (void *)std::__cxx11::string::data();
      sVar19 = std::__cxx11::string::size();
      memcpy(puVar17,pvVar18,sVar19);
      lVar20 = std::__cxx11::string::size();
      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                  *)(lVar20 + (long)local_40);
    }
    else {
      pAVar16 = std::
                unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                              *)0x1b3ce1);
      DVar7 = *(DataType *)(pAVar16 + 0x28);
      DVar14 = helper::GetDataType<std::__cxx11::string>();
      uVar11 = local_8;
      pvVar10 = local_38;
      if (DVar7 == DVar14) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,"",&local_e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_108,"/",&local_109);
        local_c0 = adios2::core::IO::InquireAttribute<std::__cxx11::string>
                             (uVar11,pvVar10,local_e0,local_108);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        local_b8 = &local_c0;
        puVar17 = Buffer::operator[](local_10,(size_t)local_40);
        *puVar17 = 'B';
        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                    *)((long)&(local_40->
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                              )._M_cur + 1);
        uVar6 = *(undefined4 *)(*local_b8 + 0x28);
        puVar17 = Buffer::operator[](local_10,(size_t)local_40);
        *puVar17 = (uint8_t)uVar6;
        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                    *)((long)local_40 + 1);
        uVar13 = std::__cxx11::string::size();
        puVar17 = Buffer::operator[](local_10,(size_t)local_40);
        *puVar17 = uVar13;
        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                    *)((long)local_40 + 1);
        puVar17 = Buffer::data(local_10,(size_t)local_40);
        pvVar18 = (void *)std::__cxx11::string::data();
        sVar19 = std::__cxx11::string::size();
        memcpy(puVar17,pvVar18,sVar19);
        lVar20 = std::__cxx11::string::size();
        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                    *)((long)local_40 + lVar20);
        if (((byte)(*local_b8)[0x38] & 1) == 0) {
          sVar23 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(*local_b8 + 0x40));
          local_118 = sVar23 << 5;
          puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
          *puVar15 = sVar23 << 5;
          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                      *)((long)local_40 + 8);
          puVar17 = Buffer::data(local_10,(size_t)local_40);
          pbVar22 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::data((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)0x1b40c6);
          memcpy(puVar17,pbVar22,local_118);
          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                      *)(local_118 + (long)local_40);
        }
        else {
          puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
          *puVar15 = 0x20;
          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                      *)((long)local_40 + 8);
          pAVar24 = *local_b8;
          pbVar22 = Buffer::value<std::__cxx11::string>(local_10,(size_t)local_40);
          std::__cxx11::string::operator=((string *)pbVar22,(string *)(pAVar24 + 0x58));
          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                      *)((long)local_40 + 0x20);
        }
      }
      else {
        pAVar16 = std::
                  unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                  ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                *)0x1b410c);
        DVar7 = *(DataType *)(pAVar16 + 0x28);
        DVar14 = helper::GetDataType<char>();
        uVar11 = local_8;
        pvVar10 = local_38;
        if (DVar7 == DVar14) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_148,"",&local_149);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_170,"/",&local_171);
          local_128 = adios2::core::IO::InquireAttribute<char>(uVar11,pvVar10,local_148,local_170);
          std::__cxx11::string::~string(local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
          std::__cxx11::string::~string(local_148);
          std::allocator<char>::~allocator((allocator<char> *)&local_149);
          local_120 = &local_128;
          puVar17 = Buffer::operator[](local_10,(size_t)local_40);
          *puVar17 = 'B';
          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                      *)((long)&(local_40->
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                )._M_cur + 1);
          uVar6 = *(undefined4 *)(*local_120 + 0x28);
          puVar17 = Buffer::operator[](local_10,(size_t)local_40);
          *puVar17 = (uint8_t)uVar6;
          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                      *)((long)local_40 + 1);
          uVar13 = std::__cxx11::string::size();
          puVar17 = Buffer::operator[](local_10,(size_t)local_40);
          *puVar17 = uVar13;
          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                      *)((long)local_40 + 1);
          puVar17 = Buffer::data(local_10,(size_t)local_40);
          pvVar18 = (void *)std::__cxx11::string::data();
          sVar19 = std::__cxx11::string::size();
          memcpy(puVar17,pvVar18,sVar19);
          lVar20 = std::__cxx11::string::size();
          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                      *)((long)local_40 + lVar20);
          if (((byte)(*local_120)[0x38] & 1) == 0) {
            sVar23 = std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)(*local_120 + 0x40));
            local_180 = sVar23;
            puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
            *puVar15 = sVar23;
            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                        *)((long)local_40 + 8);
            puVar17 = Buffer::data(local_10,(size_t)local_40);
            pcVar25 = std::vector<char,_std::allocator<char>_>::data
                                ((vector<char,_std::allocator<char>_> *)0x1b44e8);
            memcpy(puVar17,pcVar25,local_180);
            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                        *)(local_180 + (long)local_40);
          }
          else {
            puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
            *puVar15 = 1;
            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                        *)((long)local_40 + 8);
            AVar3 = (*local_120)[0x58];
            pAVar24 = (Attribute *)Buffer::value<char>(local_10,(size_t)local_40);
            *pAVar24 = AVar3;
            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                        *)((long)local_40 + 1);
          }
        }
        else {
          pAVar16 = std::
                    unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                    ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                  *)0x1b452e);
          DVar7 = *(DataType *)(pAVar16 + 0x28);
          DVar14 = helper::GetDataType<signed_char>();
          uVar11 = local_8;
          pvVar10 = local_38;
          if (DVar7 == DVar14) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1b0,"",&local_1b1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1d8,"/",&local_1d9);
            local_190 = adios2::core::IO::InquireAttribute<signed_char>
                                  (uVar11,pvVar10,local_1b0,local_1d8);
            std::__cxx11::string::~string(local_1d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
            std::__cxx11::string::~string(local_1b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
            local_188 = &local_190;
            puVar17 = Buffer::operator[](local_10,(size_t)local_40);
            *puVar17 = 'B';
            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                        *)((long)&(local_40->
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                  )._M_cur + 1);
            uVar6 = *(undefined4 *)(*local_188 + 0x28);
            puVar17 = Buffer::operator[](local_10,(size_t)local_40);
            *puVar17 = (uint8_t)uVar6;
            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                        *)((long)local_40 + 1);
            uVar13 = std::__cxx11::string::size();
            puVar17 = Buffer::operator[](local_10,(size_t)local_40);
            *puVar17 = uVar13;
            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                        *)((long)local_40 + 1);
            puVar17 = Buffer::data(local_10,(size_t)local_40);
            pvVar18 = (void *)std::__cxx11::string::data();
            sVar19 = std::__cxx11::string::size();
            memcpy(puVar17,pvVar18,sVar19);
            lVar20 = std::__cxx11::string::size();
            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                        *)((long)local_40 + lVar20);
            if (((byte)(*local_188)[0x38] & 1) == 0) {
              sVar23 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  (*local_188 + 0x40));
              local_1e8 = sVar23;
              puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
              *puVar15 = sVar23;
              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                          *)((long)local_40 + 8);
              puVar17 = Buffer::data(local_10,(size_t)local_40);
              pcVar25 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                                  ((vector<signed_char,_std::allocator<signed_char>_> *)0x1b490a);
              memcpy(puVar17,pcVar25,local_1e8);
              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                          *)(local_1e8 + (long)local_40);
            }
            else {
              puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
              *puVar15 = 1;
              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                          *)((long)local_40 + 8);
              AVar3 = (*local_188)[0x58];
              pAVar24 = (Attribute *)Buffer::value<signed_char>(local_10,(size_t)local_40);
              *pAVar24 = AVar3;
              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                          *)((long)local_40 + 1);
            }
          }
          else {
            pAVar16 = std::
                      unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                      ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                    *)0x1b4950);
            DVar7 = *(DataType *)(pAVar16 + 0x28);
            DVar14 = helper::GetDataType<short>();
            uVar11 = local_8;
            pvVar10 = local_38;
            if (DVar7 == DVar14) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_218,"",&local_219);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_240,"/",&local_241);
              local_1f8 = adios2::core::IO::InquireAttribute<short>
                                    (uVar11,pvVar10,local_218,local_240);
              std::__cxx11::string::~string(local_240);
              std::allocator<char>::~allocator((allocator<char> *)&local_241);
              std::__cxx11::string::~string(local_218);
              std::allocator<char>::~allocator((allocator<char> *)&local_219);
              local_1f0 = &local_1f8;
              puVar17 = Buffer::operator[](local_10,(size_t)local_40);
              *puVar17 = 'B';
              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                          *)((long)&(local_40->
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                    )._M_cur + 1);
              uVar6 = *(undefined4 *)(*local_1f0 + 0x28);
              puVar17 = Buffer::operator[](local_10,(size_t)local_40);
              *puVar17 = (uint8_t)uVar6;
              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                          *)((long)local_40 + 1);
              uVar13 = std::__cxx11::string::size();
              puVar17 = Buffer::operator[](local_10,(size_t)local_40);
              *puVar17 = uVar13;
              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                          *)((long)local_40 + 1);
              puVar17 = Buffer::data(local_10,(size_t)local_40);
              pvVar18 = (void *)std::__cxx11::string::data();
              sVar19 = std::__cxx11::string::size();
              memcpy(puVar17,pvVar18,sVar19);
              lVar20 = std::__cxx11::string::size();
              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                          *)((long)local_40 + lVar20);
              if (((byte)(*local_1f0)[0x38] & 1) == 0) {
                sVar23 = std::vector<short,_std::allocator<short>_>::size
                                   ((vector<short,_std::allocator<short>_> *)(*local_1f0 + 0x40));
                local_250 = sVar23 << 1;
                puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                *puVar15 = sVar23 << 1;
                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                            *)((long)local_40 + 8);
                puVar17 = Buffer::data(local_10,(size_t)local_40);
                psVar26 = std::vector<short,_std::allocator<short>_>::data
                                    ((vector<short,_std::allocator<short>_> *)0x1b4d2f);
                memcpy(puVar17,psVar26,local_250);
                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                            *)(local_250 + (long)local_40);
              }
              else {
                puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                *puVar15 = 2;
                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                            *)((long)local_40 + 8);
                sVar4 = *(short *)(*local_1f0 + 0x58);
                psVar26 = Buffer::value<short>(local_10,(size_t)local_40);
                *psVar26 = sVar4;
                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                            *)((long)local_40 + 2);
              }
            }
            else {
              pAVar16 = std::
                        unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                        ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                      *)0x1b4d75);
              DVar7 = *(DataType *)(pAVar16 + 0x28);
              DVar14 = helper::GetDataType<int>();
              uVar11 = local_8;
              pvVar10 = local_38;
              if (DVar7 == DVar14) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_280,"",&local_281);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2a8,"/",&local_2a9);
                local_260 = adios2::core::IO::InquireAttribute<int>
                                      (uVar11,pvVar10,local_280,local_2a8);
                std::__cxx11::string::~string(local_2a8);
                std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
                std::__cxx11::string::~string(local_280);
                std::allocator<char>::~allocator((allocator<char> *)&local_281);
                local_258 = &local_260;
                puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                *puVar17 = 'B';
                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                            *)((long)&(local_40->
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                      )._M_cur + 1);
                uVar6 = *(undefined4 *)(*local_258 + 0x28);
                puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                *puVar17 = (uint8_t)uVar6;
                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                            *)((long)local_40 + 1);
                uVar13 = std::__cxx11::string::size();
                puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                *puVar17 = uVar13;
                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                            *)((long)local_40 + 1);
                puVar17 = Buffer::data(local_10,(size_t)local_40);
                pvVar18 = (void *)std::__cxx11::string::data();
                sVar19 = std::__cxx11::string::size();
                memcpy(puVar17,pvVar18,sVar19);
                lVar20 = std::__cxx11::string::size();
                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                            *)((long)local_40 + lVar20);
                if (((byte)(*local_258)[0x38] & 1) == 0) {
                  sVar23 = std::vector<int,_std::allocator<int>_>::size
                                     ((vector<int,_std::allocator<int>_> *)(*local_258 + 0x40));
                  local_2b8 = sVar23 << 2;
                  puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                  *puVar15 = sVar23 << 2;
                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                              *)((long)local_40 + 8);
                  puVar17 = Buffer::data(local_10,(size_t)local_40);
                  piVar27 = std::vector<int,_std::allocator<int>_>::data
                                      ((vector<int,_std::allocator<int>_> *)0x1b5151);
                  memcpy(puVar17,piVar27,local_2b8);
                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                              *)(local_2b8 + (long)local_40);
                }
                else {
                  puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                  *puVar15 = 4;
                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                              *)((long)local_40 + 8);
                  iVar8 = *(int *)(*local_258 + 0x58);
                  piVar27 = Buffer::value<int>(local_10,(size_t)local_40);
                  *piVar27 = iVar8;
                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                              *)((long)local_40 + 4);
                }
              }
              else {
                pAVar16 = std::
                          unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                          ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                        *)0x1b5197);
                DVar7 = *(DataType *)(pAVar16 + 0x28);
                DVar14 = helper::GetDataType<long>();
                uVar11 = local_8;
                pvVar10 = local_38;
                if (DVar7 == DVar14) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_2e8,"",&local_2e9);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_310,"/",&local_311);
                  local_2c8 = adios2::core::IO::InquireAttribute<long>
                                        (uVar11,pvVar10,local_2e8,local_310);
                  std::__cxx11::string::~string(local_310);
                  std::allocator<char>::~allocator((allocator<char> *)&local_311);
                  std::__cxx11::string::~string(local_2e8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
                  local_2c0 = &local_2c8;
                  puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                  *puVar17 = 'B';
                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                              *)((long)&(local_40->
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                        )._M_cur + 1);
                  uVar6 = *(undefined4 *)(*local_2c0 + 0x28);
                  puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                  *puVar17 = (uint8_t)uVar6;
                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                              *)((long)local_40 + 1);
                  uVar13 = std::__cxx11::string::size();
                  puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                  *puVar17 = uVar13;
                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                              *)((long)local_40 + 1);
                  puVar17 = Buffer::data(local_10,(size_t)local_40);
                  pvVar18 = (void *)std::__cxx11::string::data();
                  sVar19 = std::__cxx11::string::size();
                  memcpy(puVar17,pvVar18,sVar19);
                  lVar20 = std::__cxx11::string::size();
                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                              *)((long)local_40 + lVar20);
                  if (((byte)(*local_2c0)[0x38] & 1) == 0) {
                    sVar23 = std::vector<long,_std::allocator<long>_>::size
                                       ((vector<long,_std::allocator<long>_> *)(*local_2c0 + 0x40));
                    local_320 = sVar23 << 3;
                    puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                    *puVar15 = sVar23 << 3;
                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                *)((long)local_40 + 8);
                    puVar17 = Buffer::data(local_10,(size_t)local_40);
                    plVar28 = std::vector<long,_std::allocator<long>_>::data
                                        ((vector<long,_std::allocator<long>_> *)0x1b5577);
                    memcpy(puVar17,plVar28,local_320);
                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                *)(local_320 + (long)local_40);
                  }
                  else {
                    puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                    *puVar15 = 8;
                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                *)((long)local_40 + 8);
                    lVar20 = *(long *)(*local_2c0 + 0x58);
                    plVar28 = Buffer::value<long>(local_10,(size_t)local_40);
                    *plVar28 = lVar20;
                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                *)((long)local_40 + 8);
                  }
                }
                else {
                  pAVar16 = std::
                            unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                            ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                          *)0x1b55bd);
                  DVar7 = *(DataType *)(pAVar16 + 0x28);
                  DVar14 = helper::GetDataType<unsigned_char>();
                  uVar11 = local_8;
                  pvVar10 = local_38;
                  if (DVar7 == DVar14) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_350,"",&local_351);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_378,"/",&local_379);
                    local_330 = adios2::core::IO::InquireAttribute<unsigned_char>
                                          (uVar11,pvVar10,local_350,local_378);
                    std::__cxx11::string::~string(local_378);
                    std::allocator<char>::~allocator((allocator<char> *)&local_379);
                    std::__cxx11::string::~string(local_350);
                    std::allocator<char>::~allocator((allocator<char> *)&local_351);
                    local_328 = &local_330;
                    puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                    *puVar17 = 'B';
                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                *)((long)&(local_40->
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                          )._M_cur + 1);
                    uVar6 = *(undefined4 *)(*local_328 + 0x28);
                    puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                    *puVar17 = (uint8_t)uVar6;
                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                *)((long)local_40 + 1);
                    uVar13 = std::__cxx11::string::size();
                    puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                    *puVar17 = uVar13;
                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                *)((long)local_40 + 1);
                    puVar17 = Buffer::data(local_10,(size_t)local_40);
                    pvVar18 = (void *)std::__cxx11::string::data();
                    sVar19 = std::__cxx11::string::size();
                    memcpy(puVar17,pvVar18,sVar19);
                    lVar20 = std::__cxx11::string::size();
                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                *)((long)local_40 + lVar20);
                    if (((byte)(*local_328)[0x38] & 1) == 0) {
                      sVar23 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          (*local_328 + 0x40));
                      local_388 = sVar23;
                      puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                      *puVar15 = sVar23;
                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                  *)((long)local_40 + 8);
                      puVar17 = Buffer::data(local_10,(size_t)local_40);
                      __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         0x1b5999);
                      memcpy(puVar17,__src,local_388);
                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                  *)(local_388 + (long)local_40);
                    }
                    else {
                      puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                      *puVar15 = 1;
                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                  *)((long)local_40 + 8);
                      AVar3 = (*local_328)[0x58];
                      pAVar24 = (Attribute *)Buffer::value<unsigned_char>(local_10,(size_t)local_40)
                      ;
                      *pAVar24 = AVar3;
                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                  *)((long)local_40 + 1);
                    }
                  }
                  else {
                    pAVar16 = std::
                              unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                              ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                            *)0x1b59df);
                    DVar7 = *(DataType *)(pAVar16 + 0x28);
                    DVar14 = helper::GetDataType<unsigned_short>();
                    uVar11 = local_8;
                    pvVar10 = local_38;
                    if (DVar7 == DVar14) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_3b8,"",&local_3b9);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_3e0,"/",&local_3e1);
                      local_398 = adios2::core::IO::InquireAttribute<unsigned_short>
                                            (uVar11,pvVar10,local_3b8,local_3e0);
                      std::__cxx11::string::~string(local_3e0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
                      std::__cxx11::string::~string(local_3b8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
                      local_390 = &local_398;
                      puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                      *puVar17 = 'B';
                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                  *)((long)&(local_40->
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                            )._M_cur + 1);
                      uVar6 = *(undefined4 *)(*local_390 + 0x28);
                      puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                      *puVar17 = (uint8_t)uVar6;
                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                  *)((long)local_40 + 1);
                      uVar13 = std::__cxx11::string::size();
                      puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                      *puVar17 = uVar13;
                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                  *)((long)local_40 + 1);
                      puVar17 = Buffer::data(local_10,(size_t)local_40);
                      pvVar18 = (void *)std::__cxx11::string::data();
                      sVar19 = std::__cxx11::string::size();
                      memcpy(puVar17,pvVar18,sVar19);
                      lVar20 = std::__cxx11::string::size();
                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                  *)((long)local_40 + lVar20);
                      if (((byte)(*local_390)[0x38] & 1) == 0) {
                        sVar23 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                                           ((vector<unsigned_short,_std::allocator<unsigned_short>_>
                                             *)(*local_390 + 0x40));
                        local_3f0 = sVar23 << 1;
                        puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                        *puVar15 = sVar23 << 1;
                        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                    *)((long)local_40 + 8);
                        puVar17 = Buffer::data(local_10,(size_t)local_40);
                        puVar29 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                                            ((vector<unsigned_short,_std::allocator<unsigned_short>_>
                                              *)0x1b5dbe);
                        memcpy(puVar17,puVar29,local_3f0);
                        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                    *)(local_3f0 + (long)local_40);
                      }
                      else {
                        puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                        *puVar15 = 2;
                        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                    *)((long)local_40 + 8);
                        uVar5 = *(unsigned_short *)(*local_390 + 0x58);
                        puVar29 = Buffer::value<unsigned_short>(local_10,(size_t)local_40);
                        *puVar29 = uVar5;
                        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                    *)((long)local_40 + 2);
                      }
                    }
                    else {
                      pAVar16 = std::
                                unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                              *)0x1b5e04);
                      DVar7 = *(DataType *)(pAVar16 + 0x28);
                      DVar14 = helper::GetDataType<unsigned_int>();
                      uVar11 = local_8;
                      pvVar10 = local_38;
                      if (DVar7 == DVar14) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_420,"",&local_421);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_448,"/",&local_449);
                        local_400 = adios2::core::IO::InquireAttribute<unsigned_int>
                                              (uVar11,pvVar10,local_420,local_448);
                        std::__cxx11::string::~string(local_448);
                        std::allocator<char>::~allocator((allocator<char> *)&local_449);
                        std::__cxx11::string::~string(local_420);
                        std::allocator<char>::~allocator((allocator<char> *)&local_421);
                        local_3f8 = &local_400;
                        puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                        *puVar17 = 'B';
                        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                    *)((long)&(local_40->
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                              )._M_cur + 1);
                        uVar6 = *(undefined4 *)(*local_3f8 + 0x28);
                        puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                        *puVar17 = (uint8_t)uVar6;
                        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                    *)((long)local_40 + 1);
                        uVar13 = std::__cxx11::string::size();
                        puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                        *puVar17 = uVar13;
                        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                    *)((long)local_40 + 1);
                        puVar17 = Buffer::data(local_10,(size_t)local_40);
                        pvVar18 = (void *)std::__cxx11::string::data();
                        sVar19 = std::__cxx11::string::size();
                        memcpy(puVar17,pvVar18,sVar19);
                        lVar20 = std::__cxx11::string::size();
                        local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                    *)((long)local_40 + lVar20);
                        if (((byte)(*local_3f8)[0x38] & 1) == 0) {
                          sVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *
                                              )(*local_3f8 + 0x40));
                          local_458 = sVar23 << 2;
                          puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                          *puVar15 = sVar23 << 2;
                          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                      *)((long)local_40 + 8);
                          puVar17 = Buffer::data(local_10,(size_t)local_40);
                          puVar30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                                              ((vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                *)0x1b61e0);
                          memcpy(puVar17,puVar30,local_458);
                          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                      *)(local_458 + (long)local_40);
                        }
                        else {
                          puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                          *puVar15 = 4;
                          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                      *)((long)local_40 + 8);
                          uVar9 = *(uint *)(*local_3f8 + 0x58);
                          puVar30 = Buffer::value<unsigned_int>(local_10,(size_t)local_40);
                          *puVar30 = uVar9;
                          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                      *)((long)local_40 + 4);
                        }
                      }
                      else {
                        pAVar16 = std::
                                  unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                  ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                                *)0x1b6226);
                        DVar7 = *(DataType *)(pAVar16 + 0x28);
                        DVar14 = helper::GetDataType<unsigned_long>();
                        uVar11 = local_8;
                        pvVar10 = local_38;
                        if (DVar7 == DVar14) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_488,"",&local_489);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_4b0,"/",&local_4b1);
                          local_468 = adios2::core::IO::InquireAttribute<unsigned_long>
                                                (uVar11,pvVar10,local_488,local_4b0);
                          std::__cxx11::string::~string(local_4b0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
                          std::__cxx11::string::~string(local_488);
                          std::allocator<char>::~allocator((allocator<char> *)&local_489);
                          local_460 = &local_468;
                          puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                          *puVar17 = 'B';
                          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                      *)((long)&(local_40->
                                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                                )._M_cur + 1);
                          uVar6 = *(undefined4 *)(*local_460 + 0x28);
                          puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                          *puVar17 = (uint8_t)uVar6;
                          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                      *)((long)local_40 + 1);
                          uVar13 = std::__cxx11::string::size();
                          puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                          *puVar17 = uVar13;
                          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                      *)((long)local_40 + 1);
                          puVar17 = Buffer::data(local_10,(size_t)local_40);
                          pvVar18 = (void *)std::__cxx11::string::data();
                          sVar19 = std::__cxx11::string::size();
                          memcpy(puVar17,pvVar18,sVar19);
                          lVar20 = std::__cxx11::string::size();
                          local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                      *)((long)local_40 + lVar20);
                          if (((byte)(*local_460)[0x38] & 1) == 0) {
                            sVar23 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                     size((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          (*local_460 + 0x40));
                            local_4c0 = sVar23 << 3;
                            puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                            *puVar15 = sVar23 << 3;
                            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                        *)((long)local_40 + 8);
                            puVar17 = Buffer::data(local_10,(size_t)local_40);
                            puVar15 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                                      data((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           0x1b6606);
                            memcpy(puVar17,puVar15,local_4c0);
                            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                        *)(local_4c0 + (long)local_40);
                          }
                          else {
                            puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                            *puVar15 = 8;
                            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                        *)((long)local_40 + 8);
                            uVar21 = *(unsigned_long *)(*local_460 + 0x58);
                            puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                            *puVar15 = uVar21;
                            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                        *)((long)local_40 + 8);
                          }
                        }
                        else {
                          pAVar16 = std::
                                    unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                    ::operator->((unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                                  *)0x1b664c);
                          DVar7 = *(DataType *)(pAVar16 + 0x28);
                          DVar14 = helper::GetDataType<float>();
                          uVar11 = local_8;
                          pvVar10 = local_38;
                          if (DVar7 == DVar14) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_4f0,"",&local_4f1);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_518,"/",&local_519);
                            local_4d0 = adios2::core::IO::InquireAttribute<float>
                                                  (uVar11,pvVar10,local_4f0,local_518);
                            std::__cxx11::string::~string(local_518);
                            std::allocator<char>::~allocator((allocator<char> *)&local_519);
                            std::__cxx11::string::~string(local_4f0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
                            local_4c8 = &local_4d0;
                            puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                            *puVar17 = 'B';
                            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                        *)((long)&(local_40->
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                                  )._M_cur + 1);
                            uVar6 = *(undefined4 *)(*local_4c8 + 0x28);
                            puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                            *puVar17 = (uint8_t)uVar6;
                            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                        *)((long)local_40 + 1);
                            uVar13 = std::__cxx11::string::size();
                            puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                            *puVar17 = uVar13;
                            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                        *)((long)local_40 + 1);
                            puVar17 = Buffer::data(local_10,(size_t)local_40);
                            pvVar18 = (void *)std::__cxx11::string::data();
                            sVar19 = std::__cxx11::string::size();
                            memcpy(puVar17,pvVar18,sVar19);
                            lVar20 = std::__cxx11::string::size();
                            local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                        *)((long)local_40 + lVar20);
                            if (((byte)(*local_4c8)[0x38] & 1) == 0) {
                              sVar23 = std::vector<float,_std::allocator<float>_>::size
                                                 ((vector<float,_std::allocator<float>_> *)
                                                  (*local_4c8 + 0x40));
                              local_528 = sVar23 << 2;
                              puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                              *puVar15 = sVar23 << 2;
                              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                          *)((long)local_40 + 8);
                              puVar17 = Buffer::data(local_10,(size_t)local_40);
                              pfVar31 = std::vector<float,_std::allocator<float>_>::data
                                                  ((vector<float,_std::allocator<float>_> *)0x1b6a30
                                                  );
                              memcpy(puVar17,pfVar31,local_528);
                              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                          *)(local_528 + (long)local_40);
                            }
                            else {
                              puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                              *puVar15 = 4;
                              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                          *)((long)local_40 + 8);
                              fVar1 = *(float *)(*local_4c8 + 0x58);
                              pfVar31 = Buffer::value<float>(local_10,(size_t)local_40);
                              *pfVar31 = fVar1;
                              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                          *)((long)local_40 + 4);
                            }
                          }
                          else {
                            pAVar16 = std::
                                      unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                      ::operator->((
                                                  unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                                  *)0x1b6a76);
                            DVar7 = *(DataType *)(pAVar16 + 0x28);
                            DVar14 = helper::GetDataType<double>();
                            uVar11 = local_8;
                            pvVar10 = local_38;
                            if (DVar7 == DVar14) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_558,"",&local_559);
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string(local_580,"/",&local_581);
                              local_538 = adios2::core::IO::InquireAttribute<double>
                                                    (uVar11,pvVar10,local_558,local_580);
                              std::__cxx11::string::~string(local_580);
                              std::allocator<char>::~allocator((allocator<char> *)&local_581);
                              std::__cxx11::string::~string(local_558);
                              std::allocator<char>::~allocator((allocator<char> *)&local_559);
                              local_530 = &local_538;
                              puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                              *puVar17 = 'B';
                              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                          *)((long)&(local_40->
                                                                                                        
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                                  )._M_cur + 1);
                              uVar6 = *(undefined4 *)(*local_530 + 0x28);
                              puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                              *puVar17 = (uint8_t)uVar6;
                              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                          *)((long)local_40 + 1);
                              uVar13 = std::__cxx11::string::size();
                              puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                              *puVar17 = uVar13;
                              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                          *)((long)local_40 + 1);
                              puVar17 = Buffer::data(local_10,(size_t)local_40);
                              pvVar18 = (void *)std::__cxx11::string::data();
                              sVar19 = std::__cxx11::string::size();
                              memcpy(puVar17,pvVar18,sVar19);
                              lVar20 = std::__cxx11::string::size();
                              local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                          *)((long)local_40 + lVar20);
                              if (((byte)(*local_530)[0x38] & 1) == 0) {
                                sVar23 = std::vector<double,_std::allocator<double>_>::size
                                                   ((vector<double,_std::allocator<double>_> *)
                                                    (*local_530 + 0x40));
                                local_590 = sVar23 << 3;
                                puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                                *puVar15 = sVar23 << 3;
                                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                            *)((long)local_40 + 8);
                                puVar17 = Buffer::data(local_10,(size_t)local_40);
                                pdVar32 = std::vector<double,_std::allocator<double>_>::data
                                                    ((vector<double,_std::allocator<double>_> *)
                                                     0x1b6e5a);
                                memcpy(puVar17,pdVar32,local_590);
                                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                            *)(local_590 + (long)local_40);
                              }
                              else {
                                puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                                *puVar15 = 8;
                                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                            *)((long)local_40 + 8);
                                dVar2 = *(double *)(*local_530 + 0x58);
                                pdVar32 = Buffer::value<double>(local_10,(size_t)local_40);
                                *pdVar32 = dVar2;
                                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                            *)((long)local_40 + 8);
                              }
                            }
                            else {
                              pAVar16 = std::
                                        unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                        ::operator->((
                                                  unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                                  *)0x1b6ea0);
                              DVar7 = *(DataType *)(pAVar16 + 0x28);
                              DVar14 = helper::GetDataType<long_double>();
                              uVar11 = local_8;
                              pvVar10 = local_38;
                              if (DVar7 == DVar14) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_5c0,"",&local_5c1);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_5e8,"/",&local_5e9);
                                local_5a0 = adios2::core::IO::InquireAttribute<long_double>
                                                      (uVar11,pvVar10,local_5c0,local_5e8);
                                std::__cxx11::string::~string(local_5e8);
                                std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
                                std::__cxx11::string::~string(local_5c0);
                                std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
                                local_598 = &local_5a0;
                                puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                                *puVar17 = 'B';
                                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                            *)((long)&(local_40->
                                                                                                            
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                                  )._M_cur + 1);
                                in_stack_fffffffffffff4d6 =
                                     (uint8_t)*(undefined4 *)(*local_598 + 0x28);
                                puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                                *puVar17 = in_stack_fffffffffffff4d6;
                                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                            *)((long)local_40 + 1);
                                in_stack_fffffffffffff4d7 = std::__cxx11::string::size();
                                puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                                *puVar17 = in_stack_fffffffffffff4d7;
                                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                            *)((long)local_40 + 1);
                                puVar17 = Buffer::data(local_10,(size_t)local_40);
                                pvVar18 = (void *)std::__cxx11::string::data();
                                sVar19 = std::__cxx11::string::size();
                                memcpy(puVar17,pvVar18,sVar19);
                                lVar20 = std::__cxx11::string::size();
                                local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                            *)((long)local_40 + lVar20);
                                if (((byte)(*local_598)[0x38] & 1) == 0) {
                                  sVar23 = std::vector<long_double,_std::allocator<long_double>_>::
                                           size((vector<long_double,_std::allocator<long_double>_> *
                                                )(*local_598 + 0x40));
                                  local_5f8 = sVar23 << 4;
                                  puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                                  *puVar15 = sVar23 << 4;
                                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                              *)((long)local_40 + 8);
                                  puVar17 = Buffer::data(local_10,(size_t)local_40);
                                  plVar33 = std::vector<long_double,_std::allocator<long_double>_>::
                                            data((vector<long_double,_std::allocator<long_double>_>
                                                  *)0x1b727c);
                                  memcpy(puVar17,plVar33,local_5f8);
                                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                              *)(local_5f8 + (long)local_40);
                                }
                                else {
                                  puVar15 = Buffer::value<unsigned_long>(local_10,(size_t)local_40);
                                  *puVar15 = 0x10;
                                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                              *)((long)local_40 + 8);
                                  in_stack_fffffffffffff4cc =
                                       (undefined4)*(unkbyte10 *)(*local_598 + 0x60);
                                  in_stack_fffffffffffff4d0 =
                                       (undefined6)
                                       ((unkuint10)*(unkbyte10 *)(*local_598 + 0x60) >> 0x20);
                                  plVar33 = Buffer::value<long_double>(local_10,(size_t)local_40);
                                  *plVar33 = (longdouble)
                                             CONCAT64(in_stack_fffffffffffff4d0,
                                                      in_stack_fffffffffffff4cc);
                                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                              *)((long)local_40 + 0x10);
                                }
                              }
                              else {
                                pAVar16 = std::
                                          unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                          ::operator->((
                                                  unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                                  *)0x1b72c2);
                                DVar7 = *(DataType *)(pAVar16 + 0x28);
                                DVar14 = helper::GetDataType<std::complex<float>>();
                                uVar11 = local_8;
                                pvVar10 = local_38;
                                if (DVar7 == DVar14) {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_628,"",&local_629);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_650,"/",&local_651);
                                  local_608 = adios2::core::IO::
                                              InquireAttribute<std::complex<float>>
                                                        (uVar11,pvVar10,local_628,local_650);
                                  std::__cxx11::string::~string(local_650);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_651);
                                  std::__cxx11::string::~string(local_628);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_629);
                                  local_600 = &local_608;
                                  puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                                  *puVar17 = 'B';
                                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                              *)((long)&(local_40->
                                                                                                                
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                                  )._M_cur + 1);
                                  uVar6 = *(undefined4 *)(*local_600 + 0x28);
                                  puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                                  *puVar17 = (uint8_t)uVar6;
                                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                              *)((long)local_40 + 1);
                                  uVar13 = std::__cxx11::string::size();
                                  puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                                  *puVar17 = uVar13;
                                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                              *)((long)local_40 + 1);
                                  puVar17 = Buffer::data(local_10,(size_t)local_40);
                                  pvVar18 = (void *)std::__cxx11::string::data();
                                  sVar19 = std::__cxx11::string::size();
                                  memcpy(puVar17,pvVar18,sVar19);
                                  lVar20 = std::__cxx11::string::size();
                                  local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                              *)((long)local_40 + lVar20);
                                  if (((byte)(*local_600)[0x38] & 1) == 0) {
                                    sVar23 = std::
                                             vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                             ::size((
                                                  vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                                  *)(*local_600 + 0x40));
                                    local_660 = sVar23 << 3;
                                    puVar15 = Buffer::value<unsigned_long>
                                                        (local_10,(size_t)local_40);
                                    *puVar15 = sVar23 << 3;
                                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                *)((long)local_40 + 8);
                                    puVar17 = Buffer::data(local_10,(size_t)local_40);
                                    pcVar34 = std::
                                              vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                              ::data((
                                                  vector<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                                  *)0x1b7693);
                                    memcpy(puVar17,pcVar34,local_660);
                                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                *)(local_660 + (long)local_40);
                                  }
                                  else {
                                    puVar15 = Buffer::value<unsigned_long>
                                                        (local_10,(size_t)local_40);
                                    *puVar15 = 8;
                                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                *)((long)local_40 + 8);
                                    pAVar24 = *local_600;
                                    pcVar34 = Buffer::value<std::complex<float>>
                                                        (local_10,(size_t)local_40);
                                    pcVar34->_M_value = *(_ComplexT *)(pAVar24 + 0x58);
                                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                *)((long)local_40 + 8);
                                  }
                                }
                                else {
                                  pAVar16 = std::
                                            unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                            ::operator->((
                                                  unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>
                                                  *)0x1b76d6);
                                  DVar7 = *(DataType *)(pAVar16 + 0x28);
                                  DVar14 = helper::GetDataType<std::complex<double>>();
                                  uVar11 = local_8;
                                  pvVar10 = local_38;
                                  if (DVar7 == DVar14) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_690,"",&local_691);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_6b8,"/",&local_6b9);
                                    local_670 = adios2::core::IO::
                                                InquireAttribute<std::complex<double>>
                                                          (uVar11,pvVar10,local_690,local_6b8);
                                    std::__cxx11::string::~string(local_6b8);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
                                    std::__cxx11::string::~string(local_690);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_691);
                                    local_668 = &local_670;
                                    puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                                    *puVar17 = 'B';
                                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                *)((long)&(local_40->
                                                                                                                    
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_true>
                                                  )._M_cur + 1);
                                    uVar6 = *(undefined4 *)(*local_668 + 0x28);
                                    puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                                    *puVar17 = (uint8_t)uVar6;
                                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                *)((long)local_40 + 1);
                                    uVar13 = std::__cxx11::string::size();
                                    puVar17 = Buffer::operator[](local_10,(size_t)local_40);
                                    *puVar17 = uVar13;
                                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                *)((long)local_40 + 1);
                                    puVar17 = Buffer::data(local_10,(size_t)local_40);
                                    pvVar18 = (void *)std::__cxx11::string::data();
                                    sVar19 = std::__cxx11::string::size();
                                    memcpy(puVar17,pvVar18,sVar19);
                                    lVar20 = std::__cxx11::string::size();
                                    local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                *)((long)local_40 + lVar20);
                                    if (((byte)(*local_668)[0x38] & 1) == 0) {
                                      sVar23 = std::
                                               vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                               ::size((
                                                  vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                                  *)(*local_668 + 0x40));
                                      sVar19 = sVar23 * 0x10;
                                      puVar15 = Buffer::value<unsigned_long>
                                                          (local_10,(size_t)local_40);
                                      *puVar15 = sVar19;
                                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                  *)((long)local_40 + 8);
                                      puVar17 = Buffer::data(local_10,(size_t)local_40);
                                      pcVar35 = std::
                                                vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                                ::data((
                                                  vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                                  *)0x1b7a79);
                                      memcpy(puVar17,pcVar35,sVar19);
                                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                  *)(sVar19 + (long)local_40);
                                    }
                                    else {
                                      puVar15 = Buffer::value<unsigned_long>
                                                          (local_10,(size_t)local_40);
                                      *puVar15 = 0x10;
                                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                  *)((long)local_40 + 8);
                                      pAVar24 = *local_668;
                                      pcVar35 = Buffer::value<std::complex<double>>
                                                          (local_10,(size_t)local_40);
                                      *(undefined8 *)pcVar35->_M_value =
                                           *(undefined8 *)(pAVar24 + 0x58);
                                      *(undefined8 *)(pcVar35->_M_value + 8) =
                                           *(undefined8 *)(pAVar24 + 0x60);
                                      local_40 = (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
                                                  *)((long)local_40 + 0x10);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    this = local_40;
    puVar15 = Buffer::value<unsigned_long>(local_10,0);
    *puVar15 = (unsigned_long)this;
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::AttributeBase,_std::default_delete<adios2::core::AttributeBase>_>_>,_false,_true>
    ::operator++(this);
  }
  return;
}

Assistant:

void SerializeAttributes(IO &input, Buffer &output)
{
    const auto &attributeMap = input.GetAttributes();
    for (const auto &attributePair : attributeMap)
    {
        uint64_t pos = output.value<uint64_t>();
        output.resize(pos + 1024);

        if (attributePair.second->m_Type == DataType::String)
        {
            const auto &attribute = input.InquireAttribute<std::string>(attributePair.first);
            output[pos] = 66;
            ++pos;
            output[pos] = static_cast<uint8_t>(attribute->m_Type);
            ++pos;
            output[pos] = static_cast<uint8_t>(attribute->m_Name.size());
            ++pos;
            std::memcpy(output.data(pos), attribute->m_Name.data(), attribute->m_Name.size());
            pos += attribute->m_Name.size();
            output.value<uint64_t>(pos) = attribute->m_DataSingleValue.size();
            pos += 8;
            std::memcpy(output.data(pos), attribute->m_DataSingleValue.data(),
                        attribute->m_DataSingleValue.size());
            pos += attribute->m_DataSingleValue.size();
        }
#define declare_type(T)                                                                            \
    else if (attributePair.second->m_Type == helper::GetDataType<T>())                             \
    {                                                                                              \
        const auto &attribute = input.InquireAttribute<T>(attributePair.first);                    \
        output[pos] = 66;                                                                          \
        ++pos;                                                                                     \
        output[pos] = static_cast<uint8_t>(attribute->m_Type);                                     \
        ++pos;                                                                                     \
        output[pos] = static_cast<uint8_t>(attribute->m_Name.size());                              \
        ++pos;                                                                                     \
        std::memcpy(output.data(pos), attribute->m_Name.data(), attribute->m_Name.size());         \
        pos += attribute->m_Name.size();                                                           \
        if (attribute->m_IsSingleValue)                                                            \
        {                                                                                          \
            output.value<uint64_t>(pos) = sizeof(T);                                               \
            pos += 8;                                                                              \
            output.value<T>(pos) = attribute->m_DataSingleValue;                                   \
            pos += sizeof(T);                                                                      \
        }                                                                                          \
        else                                                                                       \
        {                                                                                          \
            uint64_t size = sizeof(T) * attribute->m_DataArray.size();                             \
            output.value<uint64_t>(pos) = size;                                                    \
            pos += 8;                                                                              \
            std::memcpy(output.data(pos), attribute->m_DataArray.data(), size);                    \
            pos += size;                                                                           \
        }                                                                                          \
    }
        ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_type)
#undef declare_type
        output.value<uint64_t>() = pos;
    }
}